

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetBlendOperationLiteralName(BLEND_OPERATION BlendOp)

{
  Char *Message;
  char (*in_R8) [2];
  int local_3c;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  BLEND_OPERATION BlendOp_local;
  
  switch(BlendOp) {
  case BLEND_OPERATION_UNDEFINED:
    pcStack_10 = "BLEND_OPERATION_UNDEFINED";
    break;
  case BLEND_OPERATION_ADD:
    pcStack_10 = "BLEND_OPERATION_ADD";
    break;
  case BLEND_OPERATION_SUBTRACT:
    pcStack_10 = "BLEND_OPERATION_SUBTRACT";
    break;
  case BLEND_OPERATION_REV_SUBTRACT:
    pcStack_10 = "BLEND_OPERATION_REV_SUBTRACT";
    break;
  case BLEND_OPERATION_MIN:
    pcStack_10 = "BLEND_OPERATION_MIN";
    break;
  case BLEND_OPERATION_MAX:
    pcStack_10 = "BLEND_OPERATION_MAX";
    break;
  default:
    local_3c = (int)(char)BlendOp;
    msg.field_2._M_local_buf[0xf] = BlendOp;
    FormatString<char[29],int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected blend operation (",
               (char (*) [29])&local_3c,(int *)0xcabce5,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetBlendOperationLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x403);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetBlendOperationLiteralName(BLEND_OPERATION BlendOp)
{
#define BLEND_OP_TO_STR(BlendOp) \
    case BlendOp: return #BlendOp

    static_assert(BLEND_OPERATION_NUM_OPERATIONS == 6, "Please update the switch below to handle the new blend op");
    switch (BlendOp)
    {
        BLEND_OP_TO_STR(BLEND_OPERATION_UNDEFINED);
        BLEND_OP_TO_STR(BLEND_OPERATION_ADD);
        BLEND_OP_TO_STR(BLEND_OPERATION_SUBTRACT);
        BLEND_OP_TO_STR(BLEND_OPERATION_REV_SUBTRACT);
        BLEND_OP_TO_STR(BLEND_OPERATION_MIN);
        BLEND_OP_TO_STR(BLEND_OPERATION_MAX);

        default:
            UNEXPECTED("Unexpected blend operation (", static_cast<int>(BlendOp), ")");
            return "UNKNOWN";
    }
#undef BLEND_OP_TO_STR
}